

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Vdbe * sqlite3GetVdbe(Parse *pParse)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe *pVVar2;
  
  if (pParse->pVdbe != (Vdbe *)0x0) {
    return pParse->pVdbe;
  }
  if ((pParse->pToplevel == (Parse *)0x0) && ((pParse->db->dbOptFlags & 8) == 0)) {
    pParse->okConstFactor = '\x01';
    pVVar2 = sqlite3VdbeCreate(pParse);
    return pVVar2;
  }
  db = pParse->db;
  pVVar2 = (Vdbe *)sqlite3DbMallocRawNN(db,0x120);
  if (pVVar2 == (Vdbe *)0x0) {
    pVVar2 = (Vdbe *)0x0;
  }
  else {
    memset(&pVVar2->aOp,0,0xb8);
    pVVar2->db = db;
    pVVar1 = db->pVdbe;
    if (pVVar1 != (Vdbe *)0x0) {
      pVVar1->pPrev = pVVar2;
    }
    pVVar2->pNext = pVVar1;
    pVVar2->pPrev = (Vdbe *)0x0;
    db->pVdbe = pVVar2;
    pVVar2->magic = 0x16bceaa5;
    pVVar2->pParse = pParse;
    pParse->pVdbe = pVVar2;
    sqlite3VdbeAddOp3(pVVar2,0x3d,0,1,0);
  }
  return pVVar2;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3GetVdbe(Parse *pParse){
  if( pParse->pVdbe ){
    return pParse->pVdbe;
  }
  if( pParse->pToplevel==0
   && OptimizationEnabled(pParse->db,SQLITE_FactorOutConst)
  ){
    pParse->okConstFactor = 1;
  }
  return sqlite3VdbeCreate(pParse);
}